

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

ParsedSchema __thiscall capnp::ParsedSchema::getNested(ParsedSchema *this,StringPtr nestedName)

{
  SchemaParser *pSVar1;
  ParsedSchema PVar2;
  NullableValue<capnp::ParsedSchema> *other;
  ParsedSchema *pPVar3;
  Reader local_d8;
  ArrayPtr<const_char> local_a8;
  Fault local_98;
  Fault f;
  ParsedSchema *nested;
  Maybe<capnp::ParsedSchema> local_60;
  undefined1 local_48 [8];
  NullableValue<capnp::ParsedSchema> _nested331;
  ParsedSchema *this_local;
  StringPtr nestedName_local;
  
  nestedName_local.content.ptr = (char *)nestedName.content.size_;
  this_local = (ParsedSchema *)nestedName.content.ptr;
  _nested331.field_1.value.parser = (SchemaParser *)this;
  findNested(&local_60,this,nestedName);
  other = kj::_::readMaybe<capnp::ParsedSchema>(&local_60);
  kj::_::NullableValue<capnp::ParsedSchema>::NullableValue
            ((NullableValue<capnp::ParsedSchema> *)local_48,other);
  kj::Maybe<capnp::ParsedSchema>::~Maybe(&local_60);
  pPVar3 = kj::_::NullableValue::operator_cast_to_ParsedSchema_((NullableValue *)local_48);
  if (pPVar3 != (ParsedSchema *)0x0) {
    f.exception = (Exception *)
                  kj::_::NullableValue<capnp::ParsedSchema>::operator*
                            ((NullableValue<capnp::ParsedSchema> *)local_48);
    nestedName_local.content.size_ = (size_t)((f.exception)->ownFile).content.ptr;
    pSVar1 = (SchemaParser *)((f.exception)->ownFile).content.size_;
    kj::_::NullableValue<capnp::ParsedSchema>::~NullableValue
              ((NullableValue<capnp::ParsedSchema> *)local_48);
    PVar2.parser = pSVar1;
    PVar2.super_Schema.raw = (RawBrandedSchema *)nestedName_local.content.size_;
    return PVar2;
  }
  Schema::getProto(&local_d8,&this->super_Schema);
  local_a8 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_d8);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,char_const(&)[27],capnp::Text::Reader,kj::StringPtr&>
            (&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser.c++"
             ,0x14e,FAILED,(char *)0x0,
             "\"no such nested declaration\", getProto().getDisplayName(), nestedName",
             (char (*) [27])"no such nested declaration",(Reader *)&local_a8,
             (StringPtr *)&this_local);
  kj::_::Debug::Fault::fatal(&local_98);
}

Assistant:

ParsedSchema ParsedSchema::getNested(kj::StringPtr nestedName) const {
  KJ_IF_SOME(nested, findNested(nestedName)) {
    return nested;
  } else {
    KJ_FAIL_REQUIRE("no such nested declaration", getProto().getDisplayName(), nestedName);
  }
}